

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O3

void eltcalc::GetIntervals(int samplesize)

{
  int strLen;
  FILE *__stream;
  size_t sVar1;
  mapped_type *pmVar2;
  FILE *outFile;
  char *pcVar3;
  char *pcVar4;
  float extraout_XMM0_Da;
  float in_XMM1_Da;
  float fVar5;
  float q;
  char acStack_1060 [4104];
  float local_40;
  float local_3c;
  undefined1 local_38 [16];
  
  pcVar4 = "input/quantile.bin";
  pcVar3 = "rb";
  __stream = fopen("input/quantile.bin","rb");
  if (__stream != (FILE *)0x0) {
    sVar1 = fread(&local_40,4,1,__stream);
    if (sVar1 != 0) {
      local_3c = (float)(samplesize + -1);
      do {
        fVar5 = local_40 * local_3c + 1.0;
        local_38 = ZEXT416((uint)(fVar5 - (float)(int)fVar5));
        pmVar2 = std::
                 map<float,_interval,_std::less<float>,_std::allocator<std::pair<const_float,_interval>_>_>
                 ::operator[]((map<float,_interval,_std::less<float>,_std::allocator<std::pair<const_float,_interval>_>_>
                               *)intervals_,&local_40);
        pmVar2->integer_part = (int)fVar5;
        pmVar2->fractional_part = (float)local_38._0_4_;
        sVar1 = fread(&local_40,4,1,__stream);
      } while (sVar1 != 0);
    }
    fclose(__stream);
    return;
  }
  GetIntervals();
  strLen = sprintf(acStack_1060,"%d,%d,%d,%f,%f,%f\n",(double)extraout_XMM0_Da,
                   SUB84((double)in_XMM1_Da,0),(double)*(float *)((long)pcVar4 + 8),
                   (ulong)*(uint *)((long)pcVar4 + 4),(ulong)pcVar3 & 0xffffffff,
                   (ulong)*(uint *)pcVar4);
  WriteOutput(acStack_1060,strLen,outFile);
  return;
}

Assistant:

void GetIntervals(int samplesize)
	{
		FILE * fin = fopen(QUANTILE_FILE, "rb");
		if (fin == NULL) {
			fprintf(stderr, "FATAL: %s: Error opening file %s\n",
				__func__, QUANTILE_FILE);
			exit(EXIT_FAILURE);
		}

		float q;
		size_t i = fread(&q, sizeof(q), 1, fin);
		while (i != 0) {
			interval idx;
			float pos = (samplesize - 1) * q + 1;
			idx.integer_part = (int)pos;
			idx.fractional_part = pos - idx.integer_part;
			intervals_[q] = idx;
			i = fread(&q, sizeof(q), 1, fin);
		}

		fclose(fin);
	}